

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall
booster::locale::gnu_gettext::mo_file::load_file
          (mo_file *this,vector<char,_std::allocator<char>_> *data)

{
  int *piVar1;
  bool bVar2;
  runtime_error *prVar3;
  ulong uVar4;
  allocator local_39;
  string local_38;
  
  std::_Vector_base<char,_std::allocator<char>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->vdata_,(_Vector_impl_data *)data);
  piVar1 = (int *)(this->vdata_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  uVar4 = (long)(this->vdata_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  this->file_size_ = uVar4;
  this->data_ = (char *)piVar1;
  if (uVar4 < 4) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_38,"invalid \'mo\' file format - the file is too short",&local_39);
    runtime_error::runtime_error(prVar3,&local_38);
    __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  bVar2 = true;
  if (*piVar1 != -0x6afbed22) {
    if (*piVar1 != -0x21edfb6b) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_38,"Invalid file format - invalid magic number",&local_39);
      runtime_error::runtime_error(prVar3,&local_38);
      __cxa_throw(prVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    bVar2 = false;
  }
  this->native_byteorder_ = bVar2;
  return;
}

Assistant:

void load_file(std::vector<char> &data)
                {
                    vdata_.swap(data);
                    file_size_ = vdata_.size();
                    data_ = &vdata_[0];
                    if(file_size_ < 4 )
                        throw booster::runtime_error("invalid 'mo' file format - the file is too short");
                    uint32_t magic=0;
                    memcpy(&magic,data_,4);
                    if(magic == 0x950412de)
                        native_byteorder_ = true;
                    else if(magic == 0xde120495)
                        native_byteorder_ = false;
                    else
                        throw booster::runtime_error("Invalid file format - invalid magic number");
                }